

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O3

void predict_or_learn<true,true,false,false>(oaa *o,single_learner *base,example *ec)

{
  float fVar1;
  int iVar2;
  _func_void_int_string_v_array<char> *p_Var3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  size_t sVar7;
  v_array<char> vVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  ostream *poVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  features *this;
  ulong uVar17;
  polyprediction *ppVar18;
  bool bVar19;
  stringstream outputStringStream;
  undefined7 in_stack_fffffffffffffe08;
  char in_stack_fffffffffffffe0f;
  uint32_t uVar20;
  uint64_t uVar21;
  undefined4 in_stack_fffffffffffffe18;
  float fVar22;
  uint32_t uVar23;
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  uVar14 = (ec->l).multi.label;
  uVar17 = (ulong)uVar14;
  fVar22 = (ec->l).simple.weight;
  if ((uVar17 == 0) || ((uVar14 != 0xffffffff && (o->k < uVar17)))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"label ",6);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," is not in {1,",0xe);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"} This won\'t work right.",0x18);
    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  (ec->l).cs.costs._begin = (wclass *)0x7f7fffff;
  (ec->l).simple.initial = 0.0;
  uVar10 = o->k;
  ppVar18 = o->pred;
  if (*(code **)(base + 0x40) == (code *)0x0) {
    uVar21 = uVar10;
    if (uVar10 == 0) {
      uVar9 = (ec->super_example_predict).ft_offset;
    }
    else {
      do {
        (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
        fVar1 = (ec->pred).scalar;
        fVar4 = *(float *)((long)&ec->pred + 4);
        uVar5 = *(undefined4 *)((long)&ec->pred + 8);
        uVar6 = *(undefined4 *)((long)&ec->pred + 0xc);
        sVar7 = (ec->pred).scalars.erase_count;
        (ppVar18->scalars).end_array = (ec->pred).scalars.end_array;
        (ppVar18->scalars).erase_count = sVar7;
        ppVar18->scalar = fVar1;
        *(float *)((long)&(ppVar18->scalars)._begin + 4) = fVar4;
        *(undefined4 *)&(ppVar18->scalars)._end = uVar5;
        *(undefined4 *)((long)&(ppVar18->scalars)._end + 4) = uVar6;
        uVar9 = (ulong)*(uint *)(base + 0xe0) + (ec->super_example_predict).ft_offset;
        (ec->super_example_predict).ft_offset = uVar9;
        ppVar18 = ppVar18 + 1;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    uVar9 = uVar9 - (uint)((int)uVar21 * *(int *)(base + 0xe0));
  }
  else {
    (**(code **)(base + 0x40))
              (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec,uVar10,
               *(undefined8 *)(base + 0xe0),ppVar18,1);
    uVar9 = (ec->super_example_predict).ft_offset;
  }
  (ec->super_example_predict).ft_offset = uVar9;
  uVar12 = o->k;
  uVar16 = 1;
  if (1 < uVar12) {
    uVar16 = 1;
    uVar15 = 3;
    do {
      iVar2 = (int)uVar15;
      fVar1 = o->pred[iVar2 - 2].scalar;
      ppVar18 = o->pred + ((int)uVar16 - 1);
      if (ppVar18->scalar <= fVar1 && fVar1 != ppVar18->scalar) {
        uVar16 = (ulong)(iVar2 - 1);
      }
      bVar19 = uVar15 <= uVar12;
      uVar15 = (ulong)(iVar2 + 1);
    } while (bVar19);
  }
  this = ec->passthrough;
  if (uVar12 != 0 && this != (features *)0x0) {
    uVar15 = 1;
    uVar14 = 2;
    while( true ) {
      if (this != (features *)0x0) {
        features::push_back(this,o->pred[uVar14 - 2].scalar,uVar15 ^ 0x398d9fda640553);
        uVar12 = o->k;
      }
      uVar15 = (ulong)uVar14;
      if (uVar12 < uVar15) break;
      this = ec->passthrough;
      uVar14 = uVar14 + 1;
    }
  }
  if (uVar12 != 0) {
    uVar10 = (ec->super_example_predict).ft_offset;
    iVar2 = (int)uVar17;
    uVar14 = 0;
    do {
      (ec->l).simple.label = *(float *)(&DAT_0027c658 + (ulong)(iVar2 - 1U == uVar14) * 4);
      *(undefined8 *)((long)&(ec->l).cs.costs._begin + 4) = 0;
      (ec->pred).scalar = o->pred[uVar14].scalar;
      (ec->super_example_predict).ft_offset = uVar14 * *(int *)(base + 0xe0) + uVar10;
      (**(code **)(base + 0x38))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      uVar10 = (ec->super_example_predict).ft_offset - (ulong)(*(int *)(base + 0xe0) * uVar14);
      (ec->super_example_predict).ft_offset = uVar10;
      uVar13 = uVar14 + 2;
      uVar14 = uVar14 + 1;
    } while ((ulong)uVar13 <= o->k);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"1:",2);
  std::ostream::_M_insert<double>((double)o->pred->scalar);
  if (1 < o->k) {
    uVar14 = 3;
    do {
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,&stack0xfffffffffffffe0f,1);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      in_stack_fffffffffffffe0f = ':';
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,&stack0xfffffffffffffe0f,1);
      std::ostream::_M_insert<double>((double)o->pred[uVar14 - 2].scalar);
      uVar12 = (ulong)uVar14;
      uVar14 = uVar14 + 1;
    } while (uVar12 <= o->k);
  }
  p_Var3 = o->all->print_text;
  iVar2 = o->all->raw_prediction;
  std::__cxx11::stringbuf::str();
  vVar8._begin._7_1_ = in_stack_fffffffffffffe0f;
  vVar8._begin._0_7_ = in_stack_fffffffffffffe08;
  vVar8._end = (char *)uVar16;
  vVar8.end_array._0_4_ = in_stack_fffffffffffffe18;
  vVar8.end_array._4_4_ = fVar22;
  vVar8.erase_count = uVar17;
  (*p_Var3)(iVar2,(string)ec->tag,vVar8);
  uVar23 = (uint32_t)uVar17;
  uVar20 = (uint32_t)uVar16;
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  (ec->pred).multiclass = uVar20;
  (ec->l).multi.label = uVar23;
  (ec->l).simple.weight = fVar22;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void predict_or_learn(oaa& o, LEARNER::single_learner& base, example& ec)
{
  MULTICLASS::label_t mc_label_data = ec.l.multi;
  if (mc_label_data.label == 0 || (mc_label_data.label > o.k && mc_label_data.label != (uint32_t)-1))
    cout << "label " << mc_label_data.label << " is not in {1," << o.k << "} This won't work right." << endl;

  stringstream outputStringStream;
  uint32_t prediction = 1;
  v_array<float> scores_array;
  if (scores)
    scores_array = ec.pred.scalars;

  ec.l.simple = {FLT_MAX, 0.f, 0.f};
  base.multipredict(ec, 0, o.k, o.pred, true);
  for (uint32_t i = 2; i <= o.k; i++)
    if (o.pred[i - 1].scalar > o.pred[prediction - 1].scalar)
      prediction = i;

  if (ec.passthrough)
    for (uint32_t i = 1; i <= o.k; i++) add_passthrough_feature(ec, i, o.pred[i - 1].scalar);

  if (is_learn)
  {
    for (uint32_t i = 1; i <= o.k; i++)
    {
      ec.l.simple = {(mc_label_data.label == i) ? 1.f : -1.f, 0.f, 0.f};
      ec.pred.scalar = o.pred[i - 1].scalar;
      base.update(ec, i - 1);
    }
  }

  if (print_all)
  {
    outputStringStream << "1:" << o.pred[0].scalar;
    for (uint32_t i = 2; i <= o.k; i++) outputStringStream << ' ' << i << ':' << o.pred[i - 1].scalar;
    o.all->print_text(o.all->raw_prediction, outputStringStream.str(), ec.tag);
  }

  if (scores)
  {
    scores_array.clear();
    for (uint32_t i = 0; i < o.k; i++) scores_array.push_back(o.pred[i].scalar);
    ec.pred.scalars = scores_array;

    if (probabilities)
    {
      float sum_prob = 0;
      for (uint32_t i = 0; i < o.k; i++)
      {
        ec.pred.scalars[i] = 1.f / (1.f + correctedExp(-o.pred[i].scalar));
        sum_prob += ec.pred.scalars[i];
      }
      float inv_sum_prob = 1.f / sum_prob;
      for (uint32_t i = 0; i < o.k; i++) ec.pred.scalars[i] *= inv_sum_prob;
    }
  }
  else
    ec.pred.multiclass = prediction;

  ec.l.multi = mc_label_data;
}